

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

bool util::compareString(string *str1,char *str2)

{
  size_t sVar1;
  pointer pcVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  
  sVar1 = str1->_M_string_length;
  sVar5 = strlen(str2);
  if (sVar1 == sVar5) {
    if (sVar1 == 0) {
      bVar7 = true;
    }
    else {
      pcVar2 = (str1->_M_dataplus)._M_p;
      lVar6 = 0;
      do {
        iVar3 = tolower((int)pcVar2[lVar6]);
        iVar4 = tolower((int)str2[lVar6]);
        bVar7 = iVar3 == iVar4;
        if (!bVar7) {
          return bVar7;
        }
        bVar8 = sVar1 - 1 != lVar6;
        lVar6 = lVar6 + 1;
      } while (bVar8);
    }
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool util::compareString(const string &str1, const char* str2){
    if(str1.size() != strlen(str2))
        return false;
    for(int i = 0; i < str1.size(); i++)
        if(tolower(str1[i]) != tolower(str2[i]))
            return false;
    return true;
}